

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O0

uint32_t icu_63::util64_tou(int64_t w,UChar *buf,uint32_t len,uint32_t radix,UBool raw)

{
  UChar UVar1;
  long lVar2;
  uint local_54;
  UChar c;
  int32_t d;
  int64_t m;
  int64_t n;
  UChar *p;
  int64_t base;
  uint local_20;
  uint32_t uStack_1c;
  UBool raw_local;
  uint32_t radix_local;
  uint32_t len_local;
  UChar *buf_local;
  int64_t w_local;
  
  if (radix < 0x25) {
    local_20 = radix;
    if (radix < 2) {
      local_20 = 2;
    }
  }
  else {
    local_20 = 0x24;
  }
  if ((((len == 0) || (-1 < w)) || (local_20 != 10)) || (raw != '\0')) {
    n = (int64_t)buf;
    uStack_1c = len;
    buf_local = (UChar *)w;
    if ((len != 0) && (w == 0)) {
      UVar1 = L'0';
      if (raw != '\0') {
        UVar1 = L'\0';
      }
      n = (int64_t)(buf + 1);
      *buf = UVar1;
      uStack_1c = len - 1;
    }
  }
  else {
    buf_local = (UChar *)-w;
    n = (int64_t)(buf + 1);
    *buf = L'-';
    uStack_1c = len - 1;
  }
  for (; uStack_1c != 0 && buf_local != (UChar *)0x0; uStack_1c = uStack_1c - 1) {
    local_54 = (int)buf_local - (int)(UChar *)((long)buf_local / (long)(ulong)local_20) * local_20;
    if (raw == '\0') {
      local_54 = (uint)(byte)(&asciiDigits)[(int)local_54];
    }
    *(short *)n = (short)local_54;
    n = n + 2;
    buf_local = (UChar *)((long)buf_local / (long)(ulong)local_20);
  }
  if (uStack_1c != 0) {
    *(undefined2 *)n = 0;
  }
  lVar2 = n - (long)buf;
  _radix_local = buf;
  if (*buf == L'-') {
    _radix_local = buf + 1;
  }
  for (; n = n + -2, _radix_local < (ulong)n; _radix_local = _radix_local + 1) {
    UVar1 = *(UChar *)n;
    *(UChar *)n = *_radix_local;
    *_radix_local = UVar1;
  }
  return (uint32_t)(lVar2 >> 1);
}

Assistant:

uint32_t util64_tou(int64_t w, UChar* buf, uint32_t len, uint32_t radix, UBool raw)
{    
    if (radix > 36) {
        radix = 36;
    } else if (radix < 2) {
        radix = 2;
    }
    int64_t base = radix;

    UChar* p = buf;
    if (len && (w < 0) && (radix == 10) && !raw) {
        w = -w;
        *p++ = kUMinus;
        --len;
    } else if (len && (w == 0)) {
        *p++ = (UChar)raw ? 0 : asciiDigits[0];
        --len;
    }

    while (len && (w != 0)) {
        int64_t n = w / base;
        int64_t m = n * base;
        int32_t d = (int32_t)(w-m);
        *p++ = (UChar)(raw ? d : asciiDigits[d]);
        w = n;
        --len;
    }
    if (len) {
        *p = 0; // null terminate if room for caller convenience
    }

    len = (uint32_t)(p - buf);
    if (*buf == kUMinus) {
        ++buf;
    }
    while (--p > buf) {
        UChar c = *p;
        *p = *buf;
        *buf = c;
        ++buf;
    }

    return len;
}